

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                *matrix,map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Index IVar3;
  bool bVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  size_t *psVar7;
  undefined4 local_2c4;
  undefined *local_2c0;
  undefined4 *local_2b8;
  undefined **local_2b0;
  undefined **local_2a8;
  ulong local_2a0;
  shared_count sStack_298;
  undefined4 **local_290;
  char *local_288;
  char *local_280;
  shared_count sStack_278;
  undefined **local_270;
  undefined1 local_268;
  undefined8 *local_260;
  undefined ***local_258;
  undefined4 **local_250;
  char *local_248;
  undefined **local_240;
  char *local_238;
  shared_count sStack_230;
  char *local_228;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
  *local_220;
  vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
  *local_218;
  undefined1 local_210 [24];
  undefined8 local_1f8;
  _Base_ptr local_1f0;
  _Base_ptr local_1e8;
  _Base_ptr p_Stack_1e0;
  undefined *local_1d8;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  local_1c0;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_210,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&local_1c0,
             (vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_210);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_210);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&local_1c0);
  build_column_values<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_210,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&local_1c0,
             (vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_210);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_210);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&local_1c0);
  local_218 = matrix;
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
  ::
  Set_column<std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>>>>>
            ((Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
              *)&local_1c0,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  p_Var1 = &(rows->_M_t)._M_impl.super__Rb_tree_header;
  p_Var6 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_220 = rows;
  IVar3 = local_1c0.super_Row_access_option.columnIndex_;
  local_1f0 = local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  while ((_Rb_tree_header *)p_Var6 != p_Var1) {
    local_1c0.super_Row_access_option.columnIndex_ = IVar3;
    local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_1f0;
    if (p_Var6[2]._M_left != (_Base_ptr)0x0) {
      lVar5 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var6[1]._M_left);
      if ((*(uint *)(lVar5 + 0x28) < 6) && ((0x2bU >> (*(uint *)(lVar5 + 0x28) & 0x1f) & 1) != 0)) {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x20d);
        local_2a0 = local_2a0 & 0xffffffffffffff00;
        local_2a8 = &PTR__lazy_ostream_0022e430;
        sStack_298.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_290 = (undefined4 **)0x1e92c2;
        local_2b8 = (undefined4 *)CONCAT44(local_2b8._4_4_,*(int *)(lVar5 + 0x20));
        local_2c0 = (undefined *)CONCAT44(local_2c0._4_4_,6);
        local_240 = (undefined **)CONCAT71(local_240._1_7_,*(int *)(lVar5 + 0x20) == 6);
        local_238 = (char *)0x0;
        sStack_230.pi_ = (sp_counted_base *)0x0;
        local_288 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_280 = "";
        local_250 = &local_2b8;
        local_210._8_8_ = local_210._8_8_ & 0xffffffffffffff00;
        local_210._0_8_ = &PTR__lazy_ostream_0022e930;
        local_210._16_8_ = &boost::unit_test::lazy_ostream::inst;
        local_1f8 = &local_250;
        local_2b0 = &local_2c0;
        local_268 = 0;
        local_270 = &PTR__lazy_ostream_0022e6b0;
        local_260 = &boost::unit_test::lazy_ostream::inst;
        local_258 = &local_2b0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_240,&local_2a8,&local_288,0x20d,1,2,2,"entry.get_column_index()",local_210
                   ,"6",&local_270);
        boost::detail::shared_count::~shared_count(&sStack_230);
      }
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    IVar3 = local_1c0.super_Row_access_option.columnIndex_;
    local_1f0 = local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  }
  local_1c0.super_Row_access_option.columnIndex_ = 0;
  local_1e8 = (_Base_ptr)&local_1f8;
  local_210._4_4_ = (undefined4)((ulong)local_210._0_8_ >> 0x20);
  local_210._0_4_ = IVar3;
  local_1f8._4_4_ = (uint)((ulong)local_1f8 >> 0x20);
  if (local_1f0 == (_Base_ptr)0x0) {
    psVar7 = (size_t *)&local_1d8;
    local_1f8 = (undefined4 ***)((ulong)local_1f8._4_4_ << 0x20);
    local_1f0 = (_Base_ptr)0x0;
    p_Stack_1e0 = local_1e8;
  }
  else {
    p_Var2 = &local_1c0.column_._M_t._M_impl.super__Rb_tree_header;
    local_1f8 = (undefined4 ***)
                CONCAT44(local_1f8._4_4_,
                         local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
    local_1f0->_M_parent = local_1e8;
    psVar7 = &local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1e8 = local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Stack_1e0 = local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    local_1d8 = (undefined *)local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *psVar7 = 0;
  local_1d0 = local_1c0.operators_._0_4_;
  local_1c0.operators_._4_4_ = (undefined4)((ulong)local_1c0.operators_ >> 0x20);
  uStack_1cc = local_1c0.operators_._4_4_;
  uStack_1c8 = local_1c0.entryPool_._0_4_;
  local_1c0.entryPool_._4_4_ = (undefined4)((ulong)local_1c0.entryPool_ >> 0x20);
  uStack_1c4 = local_1c0.entryPool_._4_4_;
  local_1c0.operators_ = (Field_operators *)0x0;
  local_1c0.entryPool_ = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_238 = (char *)((ulong)local_238 & 0xffffffffffffff00);
  local_240 = &PTR__lazy_ostream_0022e430;
  sStack_230.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_2b0 = &local_2c0;
  local_2c0 = local_1d8;
  local_2b8 = &local_2c4;
  local_2c4 = 4;
  local_280 = (char *)0x0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = (undefined4 **)0x1e9df2;
  local_248 = "";
  local_258 = &local_2b0;
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_0022e3f0;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2b8;
  local_2a0 = local_2a0 & 0xffffffffffffff00;
  local_2a8 = &PTR__lazy_ostream_0022e6b0;
  sStack_298.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_288._0_1_ = local_1d8 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_238 = (char *)((ulong)local_238 & 0xffffffffffffff00);
  local_240 = &PTR__lazy_ostream_0022e430;
  sStack_230.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_2c0 = (undefined *)local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_288 = (char *)CONCAT71(local_288._1_7_,
                               (undefined *)
                               local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                               (undefined *)0x0);
  local_2c4 = 0;
  local_280 = (char *)0x0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = (undefined4 **)0x1e9df2;
  local_248 = "";
  local_2b0 = &local_2c0;
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_0022e3f0;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2b0;
  local_2b8 = &local_2c4;
  local_2a0 = local_2a0 & 0xffffffffffffff00;
  local_2a8 = &PTR__lazy_ostream_0022e6b0;
  sStack_298.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,&local_240,&local_250,0x21d,1,2,2,"col.size()",&local_270,"0",&local_2a8);
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar4 = Gudhi::persistence_matrix::operator==
                    ((local_218->
                     super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                      *)local_210);
  local_2a8 = (undefined **)CONCAT71(local_2a8._1_7_,bVar4);
  local_2a0 = 0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined **)0x1f439f;
  local_238 = "";
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_0022e378;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_258 = &local_240;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_298);
  for (p_Var6 = (local_220->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    if (p_Var6[2]._M_left != (_Base_ptr)0x0) {
      lVar5 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var6[1]._M_left);
      if ((*(uint *)(lVar5 + 0x28) < 6) && ((0x2bU >> (*(uint *)(lVar5 + 0x28) & 0x1f) & 1) != 0)) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x225,
                   &local_150);
        local_238 = (char *)((ulong)local_238 & 0xffffffffffffff00);
        local_240 = &PTR__lazy_ostream_0022e430;
        sStack_230.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_228 = "";
        local_2c0 = (undefined *)CONCAT44(local_2c0._4_4_,*(int *)(lVar5 + 0x20));
        local_2c4 = 6;
        local_288 = (char *)CONCAT71(local_288._1_7_,*(int *)(lVar5 + 0x20) == 6);
        local_280 = (char *)0x0;
        sStack_278.pi_ = (sp_counted_base *)0x0;
        local_250 = (undefined4 **)0x1e9df2;
        local_248 = "";
        local_2b0 = &local_2c0;
        local_268 = 0;
        local_270 = &PTR__lazy_ostream_0022e930;
        local_260 = &boost::unit_test::lazy_ostream::inst;
        local_258 = &local_2b0;
        local_2b8 = &local_2c4;
        local_2a0 = local_2a0 & 0xffffffffffffff00;
        local_2a8 = &PTR__lazy_ostream_0022e6b0;
        sStack_298.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_290 = &local_2b8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_288,&local_240,&local_250,0x225,1,2,2,"entry.get_column_index()",
                   &local_270,"6",&local_2a8);
        boost::detail::shared_count::~shared_count(&sStack_278);
      }
    }
  }
  Gudhi::persistence_matrix::swap
            (&local_1c0,
             (Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
              *)local_210);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_238 = (char *)((ulong)local_238 & 0xffffffffffffff00);
  local_240 = &PTR__lazy_ostream_0022e430;
  sStack_230.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_2c0 = local_1d8;
  local_2c4 = 0;
  local_280 = (char *)0x0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = (undefined4 **)0x1e9df2;
  local_248 = "";
  local_2b0 = &local_2c0;
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_0022e3f0;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2b0;
  local_2b8 = &local_2c4;
  local_2a0 = local_2a0 & 0xffffffffffffff00;
  local_2a8 = &PTR__lazy_ostream_0022e6b0;
  sStack_298.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2b8;
  local_288._0_1_ = local_1d8 == (undefined *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_238 = (char *)((ulong)local_238 & 0xffffffffffffff00);
  local_240 = &PTR__lazy_ostream_0022e430;
  sStack_230.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_2c0 = (undefined *)local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_288 = (char *)CONCAT71(local_288._1_7_,
                               (undefined *)
                               local_1c0.column_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                               (undefined *)0x4);
  local_2c4 = 4;
  local_280 = (char *)0x0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_250 = (undefined4 **)0x1e9df2;
  local_248 = "";
  local_2b0 = &local_2c0;
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_0022e3f0;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = &local_2b0;
  local_2b8 = &local_2c4;
  local_2a0 = local_2a0 & 0xffffffffffffff00;
  local_2a8 = &PTR__lazy_ostream_0022e6b0;
  sStack_298.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,&local_240,&local_250,0x235,1,2,2,"col.size()",&local_270,"4",&local_2a8);
  boost::detail::shared_count::~shared_count(&sStack_278);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar4 = Gudhi::persistence_matrix::operator==
                    ((local_218->
                     super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&local_1c0);
  local_2a8 = (undefined **)CONCAT71(local_2a8._1_7_,bVar4);
  local_2a0 = 0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined **)0x1f43b4;
  local_238 = "";
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_0022e378;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_258 = &local_240;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_298);
  for (p_Var6 = (local_220->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    if (p_Var6[2]._M_left != (_Base_ptr)0x0) {
      lVar5 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var6[1]._M_left);
      if ((*(uint *)(lVar5 + 0x28) < 6) && ((0x2bU >> (*(uint *)(lVar5 + 0x28) & 0x1f) & 1) != 0)) {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x23d,
                   &local_170);
        local_238 = (char *)((ulong)local_238 & 0xffffffffffffff00);
        local_240 = &PTR__lazy_ostream_0022e430;
        sStack_230.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_228 = "";
        local_2c0 = (undefined *)CONCAT44(local_2c0._4_4_,*(int *)(lVar5 + 0x20));
        local_2c4 = 6;
        local_288 = (char *)CONCAT71(local_288._1_7_,*(int *)(lVar5 + 0x20) == 6);
        local_280 = (char *)0x0;
        sStack_278.pi_ = (sp_counted_base *)0x0;
        local_250 = (undefined4 **)0x1e9df2;
        local_248 = "";
        local_2b0 = &local_2c0;
        local_268 = 0;
        local_270 = &PTR__lazy_ostream_0022e930;
        local_260 = &boost::unit_test::lazy_ostream::inst;
        local_258 = &local_2b0;
        local_2b8 = &local_2c4;
        local_2a0 = local_2a0 & 0xffffffffffffff00;
        local_2a8 = &PTR__lazy_ostream_0022e6b0;
        sStack_298.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_290 = &local_2b8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_288,&local_240,&local_250,0x23d,1,2,2,"entry.get_column_index()",
                   &local_270,"6",&local_2a8);
        boost::detail::shared_count::~shared_count(&sStack_278);
      }
    }
  }
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column((Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                 *)local_210);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column(&local_1c0);
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}